

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O0

ssize_t peek_at_header(archive_read_filter *filter,int *pbits)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  archive_read_filter *paVar4;
  void *pvVar5;
  int header_flags;
  int bits;
  ssize_t len;
  ssize_t avail;
  uchar *p;
  int *pbits_local;
  archive_read_filter *filter_local;
  
  _header_flags = (archive_read_filter *)0xa;
  p = (uchar *)pbits;
  pbits_local = (int *)filter;
  avail = (ssize_t)__archive_read_filter_ahead(filter,10,&len);
  if (((void *)avail == (void *)0x0) || (len == 0)) {
    filter_local = (archive_read_filter *)0x0;
  }
  else {
    iVar3 = memcmp((void *)avail,anon_var_dwarf_d9c896,3);
    if (iVar3 == 0) {
      if ((*(byte *)(avail + 3) & 0xe0) == 0) {
        bVar1 = *(byte *)(avail + 3);
        if ((bVar1 & 4) != 0) {
          avail = (ssize_t)__archive_read_filter_ahead((archive_read_filter *)pbits_local,0xc,&len);
          if ((void *)avail == (void *)0x0) {
            return 0;
          }
          _header_flags = (archive_read_filter *)((long)(int)(uint)*(ushort *)(avail + 10) + 0xc);
        }
        bVar2 = bVar1 & 8;
        while (bVar2 != 0) {
          paVar4 = (archive_read_filter *)((long)&_header_flags->position + 1);
          if (len < (long)paVar4) {
            avail = (ssize_t)__archive_read_filter_ahead
                                       ((archive_read_filter *)pbits_local,(size_t)paVar4,&len);
          }
          if (avail == 0) {
            return 0;
          }
          bVar2 = *(byte *)((long)&_header_flags->position + avail);
          _header_flags = paVar4;
        }
        bVar2 = bVar1 & 0x10;
        while (bVar2 != 0) {
          paVar4 = (archive_read_filter *)((long)&_header_flags->position + 1);
          if (len < (long)paVar4) {
            avail = (ssize_t)__archive_read_filter_ahead
                                       ((archive_read_filter *)pbits_local,(size_t)paVar4,&len);
          }
          if (avail == 0) {
            return 0;
          }
          bVar2 = *(byte *)((long)&_header_flags->position + avail);
          _header_flags = paVar4;
        }
        if ((bVar1 & 2) != 0) {
          pvVar5 = __archive_read_filter_ahead
                             ((archive_read_filter *)pbits_local,
                              (size_t)((long)&_header_flags->position + 2),&len);
          if (pvVar5 == (void *)0x0) {
            return 0;
          }
          _header_flags = (archive_read_filter *)((long)&_header_flags->position + 2);
        }
        if (p != (uchar *)0x0) {
          p[0] = '\x1b';
          p[1] = '\0';
          p[2] = '\0';
          p[3] = '\0';
        }
        filter_local = _header_flags;
      }
      else {
        filter_local = (archive_read_filter *)0x0;
      }
    }
    else {
      filter_local = (archive_read_filter *)0x0;
    }
  }
  return (ssize_t)filter_local;
}

Assistant:

static ssize_t
peek_at_header(struct archive_read_filter *filter, int *pbits)
{
	const unsigned char *p;
	ssize_t avail, len;
	int bits = 0;
	int header_flags;

	/* Start by looking at the first ten bytes of the header, which
	 * is all fixed layout. */
	len = 10;
	p = __archive_read_filter_ahead(filter, len, &avail);
	if (p == NULL || avail == 0)
		return (0);
	/* We only support deflation- third byte must be 0x08. */
	if (memcmp(p, "\x1F\x8B\x08", 3) != 0)
		return (0);
	bits += 24;
	if ((p[3] & 0xE0)!= 0)	/* No reserved flags set. */
		return (0);
	bits += 3;
	header_flags = p[3];
	/* Bytes 4-7 are mod time. */
	/* Byte 8 is deflate flags. */
	/* XXXX TODO: return deflate flags back to consume_header for use
	   in initializing the decompressor. */
	/* Byte 9 is OS. */

	/* Optional extra data:  2 byte length plus variable body. */
	if (header_flags & 4) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
		len += ((int)p[len + 1] << 8) | (int)p[len];
		len += 2;
	}

	/* Null-terminated optional filename. */
	if (header_flags & 8) {
		do {
			++len;
			if (avail < len)
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);
	}

	/* Null-terminated optional comment. */
	if (header_flags & 16) {
		do {
			++len;
			if (avail < len)
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);
	}

	/* Optional header CRC */
	if ((header_flags & 2)) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
#if 0
	int hcrc = ((int)p[len + 1] << 8) | (int)p[len];
	int crc = /* XXX TODO: Compute header CRC. */;
	if (crc != hcrc)
		return (0);
	bits += 16;
#endif
		len += 2;
	}

	if (pbits != NULL)
		*pbits = bits;
	return (len);
}